

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlogging.cpp
# Opt level: O3

void __thiscall QMessagePattern::setPattern(QMessagePattern *this,QString *pattern)

{
  QChar ch;
  _Head_base<0UL,_std::unique_ptr<const_char[],_std::default_delete<const_char[]>_>_*,_false> __ptr;
  bool bVar1;
  byte bVar2;
  QRegularExpressionMatch QVar3;
  Data *pDVar4;
  QString *pQVar5;
  bool bVar6;
  bool bVar7;
  int iVar8;
  char **ppcVar9;
  reference pvVar10;
  qsizetype qVar11;
  qlonglong qVar12;
  char **ppcVar13;
  ulong *puVar14;
  undefined8 extraout_RAX;
  char *pcVar15;
  QString *formattedMessage;
  ulong uVar16;
  QList<QString> *this_00;
  char16_t *pcVar17;
  QRegularExpressionMatchPrivate *data;
  int base;
  _Head_base<0UL,_std::unique_ptr<const_char[],_std::default_delete<const_char[]>_>_*,_false>
  __result;
  ulong uVar18;
  ulong uVar19;
  pointer __first;
  long lVar20;
  pointer __last;
  long in_FS_OFFSET;
  QStringView QVar21;
  QLatin1StringView s;
  QLatin1StringView s_00;
  QLatin1StringView s_01;
  QStringView string;
  QLatin1StringView str;
  QLatin1StringView str_00;
  QLatin1StringView str_01;
  QLatin1StringView rhs;
  QLatin1StringView rhs_00;
  QLatin1StringView rhs_01;
  QLatin1StringView rhs_02;
  QLatin1StringView rhs_03;
  QLatin1StringView rhs_04;
  QLatin1StringView rhs_05;
  QLatin1StringView rhs_06;
  QLatin1StringView rhs_07;
  QLatin1StringView rhs_08;
  QLatin1StringView rhs_09;
  QLatin1StringView rhs_10;
  QLatin1StringView rhs_11;
  QLatin1StringView rhs_12;
  QLatin1StringView rhs_13;
  QLatin1StringView rhs_14;
  QLatin1StringView rhs_15;
  QLatin1StringView rhs_16;
  QStringView lhs;
  QStringView lhs_00;
  QStringView lhs_01;
  QStringView lhs_02;
  QStringView lhs_03;
  QStringView lhs_04;
  QStringView lhs_05;
  QStringView lhs_06;
  QStringView lhs_07;
  QStringView lhs_08;
  QStringView lhs_09;
  QStringView lhs_10;
  QStringView lhs_11;
  QStringView lhs_12;
  QStringView lhs_13;
  QStringView lhs_14;
  QStringView lhs_15;
  QRegularExpressionMatch m;
  QRegularExpressionMatch local_120;
  QString local_118;
  QString local_f8;
  QString local_d8;
  vector<std::unique_ptr<const_char[],_std::default_delete<const_char[]>_>,_std::allocator<std::unique_ptr<const_char[],_std::default_delete<const_char[]>_>_>_>
  local_b8;
  QString local_98;
  QArrayDataPointer<QString> local_78;
  QStringBuilder<QStringBuilder<QLatin1String,_const_QString_&>,_QLatin1Char> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = &this->timeArgs;
  QList<QString>::clear(this_00);
  QList<QMessagePattern::BacktraceParams>::clear(&this->backtraceArgs);
  this->maxBacktraceDepth = 0;
  local_78.size = 0;
  local_78.d = (Data *)0x0;
  local_78.ptr = (QString *)0x0;
  local_98.d.size = 0;
  local_98.d.d = (Data *)0x0;
  local_98.d.ptr = (char16_t *)0x0;
  uVar19 = (pattern->d).size;
  if (uVar19 != 0) {
    bVar2 = 0;
    uVar16 = 1;
    do {
      pcVar17 = (pattern->d).ptr;
      ch.ucs = pcVar17[uVar16 - 1];
      if ((((!(bool)(ch.ucs != L'%' | bVar2)) && (uVar16 < uVar19)) && (pcVar17[uVar16] == L'{')) &&
         (bVar2 = 1, local_98.d.size != 0)) {
        QtPrivate::QMovableArrayOps<QString>::emplace<QString_const&>
                  ((QMovableArrayOps<QString> *)&local_78,local_78.size,&local_98);
        QList<QString>::end((QList<QString> *)&local_78);
        pDVar4 = local_98.d.d;
        if (local_98.d.ptr != (char16_t *)0x0) {
          local_98.d.d = (Data *)0x0;
          local_98.d.ptr = (char16_t *)0x0;
          local_98.d.size = 0;
          if (&pDVar4->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if ((pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
              QArrayData::deallocate(&pDVar4->super_QArrayData,2,0x10);
            }
          }
        }
      }
      QString::append(&local_98,ch);
      if ((bool)(ch.ucs == L'}' & bVar2)) {
        QtPrivate::QMovableArrayOps<QString>::emplace<QString_const&>
                  ((QMovableArrayOps<QString> *)&local_78,local_78.size,&local_98);
        QList<QString>::end((QList<QString> *)&local_78);
        pDVar4 = local_98.d.d;
        if (local_98.d.ptr != (char16_t *)0x0) {
          local_98.d.d = (Data *)0x0;
          local_98.d.ptr = (char16_t *)0x0;
          local_98.d.size = 0;
          if (&pDVar4->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if ((pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
              QArrayData::deallocate(&pDVar4->super_QArrayData,2,0x10);
            }
          }
        }
        bVar2 = 0;
      }
      uVar19 = (pattern->d).size;
      bVar1 = uVar16 < uVar19;
      uVar16 = uVar16 + 1;
    } while (bVar1);
    if (local_98.d.size != 0) {
      QtPrivate::QMovableArrayOps<QString>::emplace<QString_const&>
                ((QMovableArrayOps<QString> *)&local_78,local_78.size,&local_98);
      QList<QString>::end((QList<QString> *)&local_78);
    }
  }
  uVar19 = local_78.size;
  local_b8.
  super__Vector_base<std::unique_ptr<const_char[],_std::default_delete<const_char[]>_>,_std::allocator<std::unique_ptr<const_char[],_std::default_delete<const_char[]>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (unique_ptr<const_char[],_std::default_delete<const_char[]>_> *)0x0;
  local_b8.
  super__Vector_base<std::unique_ptr<const_char[],_std::default_delete<const_char[]>_>,_std::allocator<std::unique_ptr<const_char[],_std::default_delete<const_char[]>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (unique_ptr<const_char[],_std::default_delete<const_char[]>_> *)0x0;
  local_b8.
  super__Vector_base<std::unique_ptr<const_char[],_std::default_delete<const_char[]>_>,_std::allocator<std::unique_ptr<const_char[],_std::default_delete<const_char[]>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ppcVar9 = (char **)operator_new__(local_78.size * 8 + 8);
  ppcVar13 = (this->tokens)._M_t.
             super___uniq_ptr_impl<const_char_*,_std::default_delete<const_char_*[]>_>._M_t.
             super__Tuple_impl<0UL,_const_char_**,_std::default_delete<const_char_*[]>_>.
             super__Head_base<0UL,_const_char_**,_false>._M_head_impl;
  (this->tokens)._M_t.super___uniq_ptr_impl<const_char_*,_std::default_delete<const_char_*[]>_>._M_t
  .super__Tuple_impl<0UL,_const_char_**,_std::default_delete<const_char_*[]>_>.
  super__Head_base<0UL,_const_char_**,_false>._M_head_impl = ppcVar9;
  if (ppcVar13 != (char **)0x0) {
    operator_delete__(ppcVar13);
    ppcVar9 = (this->tokens)._M_t.
              super___uniq_ptr_impl<const_char_*,_std::default_delete<const_char_*[]>_>._M_t.
              super__Tuple_impl<0UL,_const_char_**,_std::default_delete<const_char_*[]>_>.
              super__Head_base<0UL,_const_char_**,_false>._M_head_impl;
    uVar19 = local_78.size;
    if (ppcVar9 != (char **)0x0) goto LAB_00210f1b;
LAB_00211d55:
    if (*(long *)(in_FS_OFFSET + 0x28) != local_38) goto LAB_00212257;
    setPattern();
LAB_00211d71:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      setPattern();
LAB_00211d8d:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        setPattern();
LAB_00211da9:
        if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
          setPattern();
LAB_00211dc5:
          if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
            setPattern();
LAB_00211de1:
            if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
              setPattern();
LAB_00211dfd:
              if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
                setPattern();
LAB_00211e19:
                if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
                  setPattern();
LAB_00211e35:
                  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
                    setPattern();
LAB_00211e51:
                    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
                      setPattern();
LAB_00211e6d:
                      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
                        setPattern();
LAB_00211e89:
                        if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
                          setPattern();
LAB_00211ea5:
                          if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
                            setPattern();
LAB_00211ec1:
                            if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
                              setPattern();
LAB_00211edd:
                              if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
                                setPattern();
LAB_00211ef9:
                                if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
                                  setPattern();
LAB_00211f15:
                                  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
                                    setPattern();
LAB_00211f31:
                                    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
                                      setPattern();
LAB_00211f4d:
                                      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
                                        setPattern();
LAB_00211f69:
                                        if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
                                          setPattern();
LAB_00211f85:
                                          if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
                                            setPattern();
LAB_00211fa1:
                                            if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
                                              setPattern();
LAB_00211fbd:
                                              if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
                                                setPattern();
                                                if ((QRegularExpressionMatchPrivate *)
                                                    local_58.a.a.m_size !=
                                                    (QRegularExpressionMatchPrivate *)0x0) {
                                                  setPattern();
                                                }
                                                __cxa_guard_abort(&setPattern(QString_const&)::
                                                                   separatorRx);
                                                if ((QRegularExpressionMatchPrivate *)local_118.d.d
                                                    != (QRegularExpressionMatchPrivate *)0x0) {
                                                  LOCK();
                                                  ((local_118.d.d)->super_QArrayData).ref_._q_value.
                                                  super___atomic_base<int>._M_i =
                                                       ((local_118.d.d)->super_QArrayData).ref_.
                                                       _q_value.super___atomic_base<int>._M_i + -1;
                                                  UNLOCK();
                                                  if (((local_118.d.d)->super_QArrayData).ref_.
                                                      _q_value.super___atomic_base<int>._M_i == 0) {
                                                    QArrayData::deallocate
                                                              (&(local_118.d.d)->super_QArrayData,2,
                                                               0x10);
                                                  }
                                                }
                                                if (&(local_f8.d.d)->super_QArrayData !=
                                                    (QArrayData *)0x0) {
                                                  LOCK();
                                                  ((local_f8.d.d)->super_QArrayData).ref_._q_value.
                                                  super___atomic_base<int>._M_i =
                                                       ((local_f8.d.d)->super_QArrayData).ref_.
                                                       _q_value.super___atomic_base<int>._M_i + -1;
                                                  UNLOCK();
                                                  if (((local_f8.d.d)->super_QArrayData).ref_.
                                                      _q_value.super___atomic_base<int>._M_i == 0) {
                                                    QArrayData::deallocate
                                                              (&(local_f8.d.d)->super_QArrayData,2,
                                                               0x10);
                                                  }
                                                }
                                                if (&(local_d8.d.d)->super_QArrayData !=
                                                    (QArrayData *)0x0) {
                                                  LOCK();
                                                  ((local_d8.d.d)->super_QArrayData).ref_._q_value.
                                                  super___atomic_base<int>._M_i =
                                                       ((local_d8.d.d)->super_QArrayData).ref_.
                                                       _q_value.super___atomic_base<int>._M_i + -1;
                                                  UNLOCK();
                                                  if (((local_d8.d.d)->super_QArrayData).ref_.
                                                      _q_value.super___atomic_base<int>._M_i == 0) {
                                                    QArrayData::deallocate
                                                              (&(local_d8.d.d)->super_QArrayData,2,
                                                               0x10);
                                                  }
                                                }
                                                std::
                                                vector<std::unique_ptr<const_char[],_std::default_delete<const_char[]>_>,_std::allocator<std::unique_ptr<const_char[],_std::default_delete<const_char[]>_>_>_>
                                                ::~vector(&local_b8);
                                                if (&(local_98.d.d)->super_QArrayData !=
                                                    (QArrayData *)0x0) {
                                                  LOCK();
                                                  ((local_98.d.d)->super_QArrayData).ref_._q_value.
                                                  super___atomic_base<int>._M_i =
                                                       ((local_98.d.d)->super_QArrayData).ref_.
                                                       _q_value.super___atomic_base<int>._M_i + -1;
                                                  UNLOCK();
                                                  if (((local_98.d.d)->super_QArrayData).ref_.
                                                      _q_value.super___atomic_base<int>._M_i == 0) {
                                                    QArrayData::deallocate
                                                              (&(local_98.d.d)->super_QArrayData,2,
                                                               0x10);
                                                  }
                                                }
                                                QArrayDataPointer<QString>::~QArrayDataPointer
                                                          (&local_78);
                                                if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
                                                  _Unwind_Resume(extraout_RAX);
                                                }
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    goto LAB_00212257;
  }
LAB_00210f1b:
  ppcVar9[uVar19] = (char *)0x0;
  local_d8.d.size = 0;
  local_d8.d.d = (Data *)0x0;
  local_d8.d.ptr = (char16_t *)0x0;
  if (uVar19 == 0) goto LAB_00211bc9;
  lVar20 = 2;
  uVar19 = 0;
  bVar2 = 0;
  bVar1 = false;
LAB_00210f64:
  local_f8.d.d = *(Data **)((long)local_78.ptr + lVar20 * 8 + -0x10);
  local_f8.d.ptr = *(char16_t **)((long)local_78.ptr + lVar20 * 8 + -8);
  local_f8.d.size = (qsizetype)(&((local_78.ptr)->d).d)[lVar20];
  if (&(local_f8.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_f8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_f8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  s.m_data = "%{";
  s.m_size = 2;
  bVar6 = QString::startsWith(&local_f8,s,CaseSensitive);
  if ((!bVar6) ||
     (bVar6 = QString::endsWith(&local_f8,(QChar)0x7d,CaseSensitive), qVar11 = local_f8.d.size,
     !bVar6)) {
    QString::toLatin1_helper((QByteArray *)&local_58,&local_f8);
    pcVar17 = (char16_t *)local_58.a.a.m_data;
    if ((char16_t *)local_58.a.a.m_data == (char16_t *)0x0) {
      pcVar17 = (char16_t *)&QByteArray::_empty;
    }
    local_118.d.d = (Data *)qstrdup((char *)pcVar17);
    pvVar10 = std::
              vector<std::unique_ptr<char_const[],std::default_delete<char_const[]>>,std::allocator<std::unique_ptr<char_const[],std::default_delete<char_const[]>>>>
              ::emplace_back<std::unique_ptr<char[],std::default_delete<char[]>>>
                        ((vector<std::unique_ptr<char_const[],std::default_delete<char_const[]>>,std::allocator<std::unique_ptr<char_const[],std::default_delete<char_const[]>>>>
                          *)&local_b8,(unique_ptr<char[],_std::default_delete<char[]>_> *)&local_118
                        );
    ppcVar13 = (this->tokens)._M_t.
               super___uniq_ptr_impl<const_char_*,_std::default_delete<const_char_*[]>_>._M_t.
               super__Tuple_impl<0UL,_const_char_**,_std::default_delete<const_char_*[]>_>.
               super__Head_base<0UL,_const_char_**,_false>._M_head_impl;
    if (ppcVar13 != (char **)0x0) {
      ppcVar13[uVar19] =
           (pvVar10->_M_t).super___uniq_ptr_impl<const_char,_std::default_delete<const_char[]>_>.
           _M_t.super__Tuple_impl<0UL,_const_char_*,_std::default_delete<const_char[]>_>.
           super__Head_base<0UL,_const_char_*,_false>._M_head_impl;
      if ((QRegularExpressionMatchPrivate *)local_118.d.d != (QRegularExpressionMatchPrivate *)0x0)
      {
        operator_delete__(local_118.d.d);
      }
      local_118.d.d = (Data *)0x0;
      if ((QRegularExpressionMatchPrivate *)local_58.a.a.m_size !=
          (QRegularExpressionMatchPrivate *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)local_58.a.a.m_size)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)local_58.a.a.m_size)->_q_value).super___atomic_base<int>._M_i + -1
        ;
        UNLOCK();
        if ((((QBasicAtomicInt *)local_58.a.a.m_size)->_q_value).super___atomic_base<int>._M_i == 0)
        {
          qVar11 = 1;
          data = (QRegularExpressionMatchPrivate *)local_58.a.a.m_size;
LAB_002110d2:
          QArrayData::deallocate((QArrayData *)data,qVar11,0x10);
        }
      }
      goto LAB_0021137a;
    }
    if (*(long *)(in_FS_OFFSET + 0x28) != local_38) goto LAB_00212257;
    setPattern();
    goto LAB_00211d55;
  }
  if ((Data *)local_f8.d.size == (Data *)0xb) {
    rhs_01.m_data = "%{category}";
    rhs_01.m_size = 0xb;
    QVar21.m_data = local_f8.d.ptr;
    QVar21.m_size = 0xb;
    bVar6 = QtPrivate::equalStrings(QVar21,rhs_01);
    if (!bVar6) {
      rhs_06.m_data = "%{function}";
      rhs_06.m_size = 0xb;
      lhs_05.m_data = local_f8.d.ptr;
      lhs_05.m_size = 0xb;
      bVar7 = QtPrivate::equalStrings(lhs_05,rhs_06);
      bVar6 = true;
      if (!bVar7) goto LAB_00211166;
      ppcVar13 = (this->tokens)._M_t.
                 super___uniq_ptr_impl<const_char_*,_std::default_delete<const_char_*[]>_>._M_t.
                 super__Tuple_impl<0UL,_const_char_**,_std::default_delete<const_char_*[]>_>.
                 super__Head_base<0UL,_const_char_**,_false>._M_head_impl;
      if (ppcVar13 != (char **)0x0) {
        ppcVar13[uVar19] = "%{function}";
        goto LAB_0021137a;
      }
      goto LAB_00211e19;
    }
    ppcVar13 = (this->tokens)._M_t.
               super___uniq_ptr_impl<const_char_*,_std::default_delete<const_char_*[]>_>._M_t.
               super__Tuple_impl<0UL,_const_char_**,_std::default_delete<const_char_*[]>_>.
               super__Head_base<0UL,_const_char_**,_false>._M_head_impl;
    if (ppcVar13 == (char **)0x0) goto LAB_00211dc5;
    pcVar15 = "%{category}";
LAB_00211376:
    ppcVar13[uVar19] = pcVar15;
    goto LAB_0021137a;
  }
  if ((Data *)local_f8.d.size != (Data *)0xa) {
    if ((Data *)local_f8.d.size == (Data *)0x7) {
      rhs.m_data = "%{type}";
      rhs.m_size = 7;
      lhs.m_data = local_f8.d.ptr;
      lhs.m_size = 7;
      bVar6 = QtPrivate::equalStrings(lhs,rhs);
      if (bVar6) {
        ppcVar13 = (this->tokens)._M_t.
                   super___uniq_ptr_impl<const_char_*,_std::default_delete<const_char_*[]>_>._M_t.
                   super__Tuple_impl<0UL,_const_char_**,_std::default_delete<const_char_*[]>_>.
                   super__Head_base<0UL,_const_char_**,_false>._M_head_impl;
        if (ppcVar13 == (char **)0x0) goto LAB_00211d8d;
        pcVar15 = "%{type}";
      }
      else {
        rhs_07.m_data = "%{file}";
        rhs_07.m_size = 7;
        lhs_06.m_data = local_f8.d.ptr;
        lhs_06.m_size = 7;
        bVar6 = QtPrivate::equalStrings(lhs_06,rhs_07);
        if (bVar6) {
          ppcVar13 = (this->tokens)._M_t.
                     super___uniq_ptr_impl<const_char_*,_std::default_delete<const_char_*[]>_>._M_t.
                     super__Tuple_impl<0UL,_const_char_**,_std::default_delete<const_char_*[]>_>.
                     super__Head_base<0UL,_const_char_**,_false>._M_head_impl;
          if (ppcVar13 == (char **)0x0) goto LAB_00211e51;
          pcVar15 = "%{file}";
        }
        else {
          rhs_08.m_data = "%{line}";
          rhs_08.m_size = 7;
          lhs_07.m_data = local_f8.d.ptr;
          lhs_07.m_size = 7;
          bVar6 = QtPrivate::equalStrings(lhs_07,rhs_08);
          if (!bVar6) goto LAB_002113b7;
          ppcVar13 = (this->tokens)._M_t.
                     super___uniq_ptr_impl<const_char_*,_std::default_delete<const_char_*[]>_>._M_t.
                     super__Tuple_impl<0UL,_const_char_**,_std::default_delete<const_char_*[]>_>.
                     super__Head_base<0UL,_const_char_**,_false>._M_head_impl;
          if (ppcVar13 == (char **)0x0) goto LAB_00211ec1;
          pcVar15 = "%{line}";
        }
      }
    }
    else {
      bVar6 = false;
LAB_00211166:
      if (((Data *)qVar11 == (Data *)0x6) &&
         (rhs_02.m_data = "%{pid}", rhs_02.m_size = 6, lhs_01.m_data = local_f8.d.ptr,
         lhs_01.m_size = 6, bVar7 = QtPrivate::equalStrings(lhs_01,rhs_02), bVar7)) {
        ppcVar13 = (this->tokens)._M_t.
                   super___uniq_ptr_impl<const_char_*,_std::default_delete<const_char_*[]>_>._M_t.
                   super__Tuple_impl<0UL,_const_char_**,_std::default_delete<const_char_*[]>_>.
                   super__Head_base<0UL,_const_char_**,_false>._M_head_impl;
        if (ppcVar13 != (char **)0x0) {
          pcVar15 = "%{pid}";
          goto LAB_00211376;
        }
        goto LAB_00211dfd;
      }
      if ((!bVar6) ||
         (rhs_03.m_data = "%{threadid}", rhs_03.m_size = 0xb, lhs_02.m_data = local_f8.d.ptr,
         lhs_02.m_size = 0xb, bVar6 = QtPrivate::equalStrings(lhs_02,rhs_03), !bVar6))
      goto LAB_00211236;
      ppcVar13 = (this->tokens)._M_t.
                 super___uniq_ptr_impl<const_char_*,_std::default_delete<const_char_*[]>_>._M_t.
                 super__Tuple_impl<0UL,_const_char_**,_std::default_delete<const_char_*[]>_>.
                 super__Head_base<0UL,_const_char_**,_false>._M_head_impl;
      if (ppcVar13 == (char **)0x0) goto LAB_00211e89;
      pcVar15 = "%{threadid}";
    }
    goto LAB_00211376;
  }
  rhs_00.m_data = "%{message}";
  rhs_00.m_size = 10;
  lhs_00.m_data = local_f8.d.ptr;
  lhs_00.m_size = 10;
  bVar6 = QtPrivate::equalStrings(lhs_00,rhs_00);
  if (bVar6) {
    ppcVar13 = (this->tokens)._M_t.
               super___uniq_ptr_impl<const_char_*,_std::default_delete<const_char_*[]>_>._M_t.
               super__Tuple_impl<0UL,_const_char_**,_std::default_delete<const_char_*[]>_>.
               super__Head_base<0UL,_const_char_**,_false>._M_head_impl;
    if (ppcVar13 != (char **)0x0) {
      pcVar15 = "%{message}";
      goto LAB_00211376;
    }
    goto LAB_00211da9;
  }
  rhs_04.m_data = "%{appname}";
  rhs_04.m_size = 10;
  lhs_03.m_data = local_f8.d.ptr;
  lhs_03.m_size = 10;
  bVar6 = QtPrivate::equalStrings(lhs_03,rhs_04);
  if (bVar6) {
    ppcVar13 = (this->tokens)._M_t.
               super___uniq_ptr_impl<const_char_*,_std::default_delete<const_char_*[]>_>._M_t.
               super__Tuple_impl<0UL,_const_char_**,_std::default_delete<const_char_*[]>_>.
               super__Head_base<0UL,_const_char_**,_false>._M_head_impl;
    if (ppcVar13 != (char **)0x0) {
      pcVar15 = "%{appname}";
      goto LAB_00211376;
    }
    goto LAB_00211e35;
  }
LAB_00211236:
  if ((Data *)qVar11 == (Data *)0xd) {
    rhs_05.m_data = "%{threadname}";
    rhs_05.m_size = 0xd;
    lhs_04.m_data = local_f8.d.ptr;
    lhs_04.m_size = 0xd;
    bVar6 = QtPrivate::equalStrings(lhs_04,rhs_05);
    if (!bVar6) {
      rhs_09.m_data = "%{qthreadptr}";
      rhs_09.m_size = 0xd;
      lhs_08.m_data = local_f8.d.ptr;
      lhs_08.m_size = 0xd;
      bVar6 = QtPrivate::equalStrings(lhs_08,rhs_09);
      if (!bVar6) goto LAB_002113b7;
      ppcVar13 = (this->tokens)._M_t.
                 super___uniq_ptr_impl<const_char_*,_std::default_delete<const_char_*[]>_>._M_t.
                 super__Tuple_impl<0UL,_const_char_**,_std::default_delete<const_char_*[]>_>.
                 super__Head_base<0UL,_const_char_**,_false>._M_head_impl;
      if (ppcVar13 != (char **)0x0) {
        pcVar15 = "%{qthreadptr}";
        goto LAB_00211376;
      }
      goto LAB_00211edd;
    }
    ppcVar13 = (this->tokens)._M_t.
               super___uniq_ptr_impl<const_char_*,_std::default_delete<const_char_*[]>_>._M_t.
               super__Tuple_impl<0UL,_const_char_**,_std::default_delete<const_char_*[]>_>.
               super__Head_base<0UL,_const_char_**,_false>._M_head_impl;
    if (ppcVar13 == (char **)0x0) goto LAB_00211e6d;
    pcVar15 = "%{threadname}";
    goto LAB_00211376;
  }
LAB_002113b7:
  s_00.m_data = "%{time";
  s_00.m_size = 6;
  bVar6 = QString::startsWith(&local_f8,s_00,CaseSensitive);
  if (bVar6) {
    ppcVar13 = (this->tokens)._M_t.
               super___uniq_ptr_impl<const_char_*,_std::default_delete<const_char_*[]>_>._M_t.
               super__Tuple_impl<0UL,_const_char_**,_std::default_delete<const_char_*[]>_>.
               super__Head_base<0UL,_const_char_**,_false>._M_head_impl;
    if (ppcVar13 != (char **)0x0) {
      ppcVar13[uVar19] = "%{time";
      qVar11 = QString::indexOf(&local_f8,(QChar)0x20,0,CaseSensitive);
      if (qVar11 < 1) {
        local_58.a.a.m_size = 0;
        local_58.a.a.m_data = (char *)0x0;
        local_58.a.b = (QString *)0x0;
        QList<QString>::append(this_00,(rvalue_ref)&local_58);
      }
      else {
        QString::mid((QString *)&local_58,&local_f8,qVar11 + 1,local_f8.d.size + (-2 - qVar11));
        QList<QString>::append(this_00,(rvalue_ref)&local_58);
      }
      if ((QRegularExpressionMatchPrivate *)local_58.a.a.m_size !=
          (QRegularExpressionMatchPrivate *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)local_58.a.a.m_size)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)local_58.a.a.m_size)->_q_value).super___atomic_base<int>._M_i + -1
        ;
        iVar8 = (((QBasicAtomicInt *)local_58.a.a.m_size)->_q_value).super___atomic_base<int>._M_i;
        UNLOCK();
        data = (QRegularExpressionMatchPrivate *)local_58.a.a.m_size;
joined_r0x00211619:
        if (iVar8 == 0) {
          qVar11 = 2;
          goto LAB_002110d2;
        }
      }
      goto LAB_0021137a;
    }
    goto LAB_00211de1;
  }
  s_01.m_data = "%{backtrace";
  s_01.m_size = 0xb;
  bVar6 = QString::startsWith(&local_f8,s_01,CaseSensitive);
  qVar11 = local_f8.d.size;
  if (bVar6) {
    ppcVar13 = (this->tokens)._M_t.
               super___uniq_ptr_impl<const_char_*,_std::default_delete<const_char_*[]>_>._M_t.
               super__Tuple_impl<0UL,_const_char_**,_std::default_delete<const_char_*[]>_>.
               super__Head_base<0UL,_const_char_**,_false>._M_head_impl;
    if (ppcVar13 != (char **)0x0) {
      ppcVar13[uVar19] = "%{backtrace";
      local_118.d.d = (Data *)0x0;
      local_118.d.ptr = L"|";
      local_118.d.size = 1;
      if ((setPattern(QString_const&)::depthRx == '\0') &&
         (iVar8 = __cxa_guard_acquire(&setPattern(QString_const&)::depthRx), iVar8 != 0)) {
        local_58.a.a.m_size = 0;
        local_58.a.a.m_data = " depth=(?|\"([^\"]*)\"|([^ }]*))";
        local_58.a.b = (QString *)0x1d;
        QRegularExpression::QRegularExpression
                  (&setPattern::depthRx,(QString *)&local_58,(PatternOptions)0x0);
        if ((QRegularExpressionMatchPrivate *)local_58.a.a.m_size !=
            (QRegularExpressionMatchPrivate *)0x0) {
          LOCK();
          (((QBasicAtomicInt *)local_58.a.a.m_size)->_q_value).super___atomic_base<int>._M_i =
               (((QBasicAtomicInt *)local_58.a.a.m_size)->_q_value).super___atomic_base<int>._M_i +
               -1;
          UNLOCK();
          if ((((QBasicAtomicInt *)local_58.a.a.m_size)->_q_value).super___atomic_base<int>._M_i ==
              0) {
            QArrayData::deallocate((QArrayData *)local_58.a.a.m_size,2,0x10);
          }
        }
        __cxa_atexit(QRegularExpression::~QRegularExpression,&setPattern::depthRx,&__dso_handle);
        __cxa_guard_release(&setPattern(QString_const&)::depthRx);
      }
      if ((setPattern(QString_const&)::separatorRx == '\0') &&
         (iVar8 = __cxa_guard_acquire(&setPattern(QString_const&)::separatorRx), iVar8 != 0)) {
        local_58.a.a.m_size = 0;
        local_58.a.a.m_data = " separator=(?|\"([^\"]*)\"|([^ }]*))";
        local_58.a.b = (QString *)0x21;
        QRegularExpression::QRegularExpression
                  (&setPattern::separatorRx,(QString *)&local_58,(PatternOptions)0x0);
        if ((QRegularExpressionMatchPrivate *)local_58.a.a.m_size !=
            (QRegularExpressionMatchPrivate *)0x0) {
          LOCK();
          (((QBasicAtomicInt *)local_58.a.a.m_size)->_q_value).super___atomic_base<int>._M_i =
               (((QBasicAtomicInt *)local_58.a.a.m_size)->_q_value).super___atomic_base<int>._M_i +
               -1;
          UNLOCK();
          if ((((QBasicAtomicInt *)local_58.a.a.m_size)->_q_value).super___atomic_base<int>._M_i ==
              0) {
            QArrayData::deallocate((QArrayData *)local_58.a.a.m_size,2,0x10);
          }
        }
        __cxa_atexit(QRegularExpression::~QRegularExpression,&setPattern::separatorRx,&__dso_handle)
        ;
        __cxa_guard_release(&setPattern(QString_const&)::separatorRx);
      }
      local_120.d.d.ptr =
           (QExplicitlySharedDataPointer<QRegularExpressionMatchPrivate>)&DAT_aaaaaaaaaaaaaaaa;
      base = 0;
      QRegularExpression::match
                ((QRegularExpression *)&local_120,(QString *)&setPattern::depthRx,
                 (qsizetype)&local_f8,NormalMatch,(MatchOptions)0x0);
      bVar6 = QRegularExpressionMatch::hasMatch(&local_120);
      iVar8 = 5;
      if (bVar6) {
        QVar21 = QRegularExpressionMatch::capturedView(&local_120,1);
        string.m_data = (storage_type_conflict *)0x0;
        string.m_size = (qsizetype)QVar21.m_data;
        qVar12 = QString::toIntegral_helper((QString *)QVar21.m_size,string,(bool *)0xa,base);
        if (qVar12 - 0x80000000U < 0xffffffff80000001) {
          str.m_data = "QT_MESSAGE_PATTERN: %{backtrace} depth must be a number greater than 0\n";
          str.m_size = 0x47;
          QString::append(&local_d8,str);
        }
        else {
          iVar8 = (int)qVar12;
        }
      }
      QRegularExpression::match
                ((QRegularExpression *)&local_58,(QString *)&setPattern::separatorRx,
                 (qsizetype)&local_f8,NormalMatch,(MatchOptions)0x0);
      QVar3.d.d.ptr = local_120.d.d.ptr;
      local_120.d.d.ptr =
           (QExplicitlySharedDataPointer<QRegularExpressionMatchPrivate>)
           (QExplicitlySharedDataPointer<QRegularExpressionMatchPrivate>)local_58.a.a.m_size;
      local_58.a.a.m_size = (qsizetype)QVar3.d.d.ptr;
      QRegularExpressionMatch::~QRegularExpressionMatch((QRegularExpressionMatch *)&local_58);
      bVar6 = QRegularExpressionMatch::hasMatch(&local_120);
      if (bVar6) {
        QRegularExpressionMatch::captured((QString *)&local_58,&local_120,1);
        pQVar5 = local_58.a.b;
        qVar11 = local_58.a.a.m_size;
        pcVar17 = local_118.d.ptr;
        pDVar4 = local_118.d.d;
        local_58.a.a.m_size = (qsizetype)local_118.d.d;
        local_118.d.d = (Data *)qVar11;
        local_118.d.ptr = (char16_t *)local_58.a.a.m_data;
        local_58.a.a.m_data = (char *)pcVar17;
        local_58.a.b = (QString *)local_118.d.size;
        local_118.d.size = (qsizetype)pQVar5;
        if ((QRegularExpressionMatchPrivate *)pDVar4 != (QRegularExpressionMatchPrivate *)0x0) {
          LOCK();
          (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&pDVar4->super_QArrayData,2,0x10);
          }
        }
      }
      local_58.a.a.m_size = 0;
      local_58.a.a.m_data = (char *)0x0;
      local_58.a.b = (QString *)0x0;
      local_58._28_4_ = 0xaaaaaaaa;
      local_58._24_4_ = iVar8;
      QString::operator=((QString *)&local_58,&local_118);
      QList<QMessagePattern::BacktraceParams>::append
                (&this->backtraceArgs,(parameter_type)&local_58);
      if (iVar8 < this->maxBacktraceDepth) {
        iVar8 = this->maxBacktraceDepth;
      }
      this->maxBacktraceDepth = iVar8;
      if ((QRegularExpressionMatchPrivate *)local_58.a.a.m_size !=
          (QRegularExpressionMatchPrivate *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)local_58.a.a.m_size)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)local_58.a.a.m_size)->_q_value).super___atomic_base<int>._M_i + -1
        ;
        UNLOCK();
        if ((((QBasicAtomicInt *)local_58.a.a.m_size)->_q_value).super___atomic_base<int>._M_i == 0)
        {
          QArrayData::deallocate((QArrayData *)local_58.a.a.m_size,2,0x10);
        }
      }
      QRegularExpressionMatch::~QRegularExpressionMatch(&local_120);
      if ((QRegularExpressionMatchPrivate *)local_118.d.d != (QRegularExpressionMatchPrivate *)0x0)
      {
        LOCK();
        ((local_118.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_118.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        iVar8 = ((local_118.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i;
        UNLOCK();
        data = (QRegularExpressionMatchPrivate *)local_118.d.d;
        goto joined_r0x00211619;
      }
      goto LAB_0021137a;
    }
    goto LAB_00211ea5;
  }
  switch(local_f8.d.size) {
  case 8:
switchD_00211568_caseD_8:
    rhs_10.m_data = "%{endif}";
    rhs_10.m_size = 8;
    lhs_09.m_data = local_f8.d.ptr;
    lhs_09.m_size = 8;
    bVar6 = QtPrivate::equalStrings(lhs_09,rhs_10);
    if (bVar6) {
      ppcVar13 = (this->tokens)._M_t.
                 super___uniq_ptr_impl<const_char_*,_std::default_delete<const_char_*[]>_>._M_t.
                 super__Tuple_impl<0UL,_const_char_**,_std::default_delete<const_char_*[]>_>.
                 super__Head_base<0UL,_const_char_**,_false>._M_head_impl;
      if (ppcVar13 != (char **)0x0) {
        ppcVar13[uVar19] = "%{endif}";
        if ((!bVar1) && (bVar2 == 0)) {
          str_00.m_data = "QT_MESSAGE_PATTERN: %{endif} without an %{if-*}\n";
          str_00.m_size = 0x30;
          QString::append(&local_d8,str_00);
        }
        bVar1 = false;
        goto LAB_0021137a;
      }
      goto LAB_00211f15;
    }
    break;
  case 10:
    rhs_12.m_data = "%{if-info}";
    rhs_12.m_size = 10;
    lhs_11.m_data = local_f8.d.ptr;
    lhs_11.m_size = 10;
    bVar6 = QtPrivate::equalStrings(lhs_11,rhs_12);
    if (bVar6) {
      ppcVar13 = (this->tokens)._M_t.
                 super___uniq_ptr_impl<const_char_*,_std::default_delete<const_char_*[]>_>._M_t.
                 super__Tuple_impl<0UL,_const_char_**,_std::default_delete<const_char_*[]>_>.
                 super__Head_base<0UL,_const_char_**,_false>._M_head_impl;
      if (ppcVar13 != (char **)0x0) {
        if (bVar1) {
          bVar2 = 1;
        }
        pcVar15 = "%{if-info}";
        goto LAB_002119b8;
      }
      goto LAB_00211f69;
    }
    break;
  case 0xb:
    rhs_11.m_data = "%{if-debug}";
    rhs_11.m_size = 0xb;
    lhs_10.m_data = local_f8.d.ptr;
    lhs_10.m_size = 0xb;
    bVar6 = QtPrivate::equalStrings(lhs_10,rhs_11);
    if (!bVar6) {
      rhs_15.m_data = "%{if-fatal}";
      rhs_15.m_size = 0xb;
      lhs_14.m_data = local_f8.d.ptr;
      lhs_14.m_size = 0xb;
      bVar6 = QtPrivate::equalStrings(lhs_14,rhs_15);
      if (!bVar6) {
LAB_002119c7:
        if ((Data *)qVar11 == (Data *)0x8) goto switchD_00211568_caseD_8;
        break;
      }
      ppcVar13 = (this->tokens)._M_t.
                 super___uniq_ptr_impl<const_char_*,_std::default_delete<const_char_*[]>_>._M_t.
                 super__Tuple_impl<0UL,_const_char_**,_std::default_delete<const_char_*[]>_>.
                 super__Head_base<0UL,_const_char_**,_false>._M_head_impl;
      if (ppcVar13 != (char **)0x0) {
        if (bVar1) {
          bVar2 = 1;
        }
        pcVar15 = "%{if-fatal}";
        goto LAB_002119b8;
      }
      goto LAB_00211fa1;
    }
    ppcVar13 = (this->tokens)._M_t.
               super___uniq_ptr_impl<const_char_*,_std::default_delete<const_char_*[]>_>._M_t.
               super__Tuple_impl<0UL,_const_char_**,_std::default_delete<const_char_*[]>_>.
               super__Head_base<0UL,_const_char_**,_false>._M_head_impl;
    if (ppcVar13 == (char **)0x0) goto LAB_00211f31;
    if (bVar1) {
      bVar2 = 1;
    }
    pcVar15 = "%{if-debug}";
    goto LAB_002119b8;
  case 0xd:
    rhs_13.m_data = "%{if-warning}";
    rhs_13.m_size = 0xd;
    lhs_12.m_data = local_f8.d.ptr;
    lhs_12.m_size = 0xd;
    bVar6 = QtPrivate::equalStrings(lhs_12,rhs_13);
    if (bVar6) {
      ppcVar13 = (this->tokens)._M_t.
                 super___uniq_ptr_impl<const_char_*,_std::default_delete<const_char_*[]>_>._M_t.
                 super__Tuple_impl<0UL,_const_char_**,_std::default_delete<const_char_*[]>_>.
                 super__Head_base<0UL,_const_char_**,_false>._M_head_impl;
      if (ppcVar13 != (char **)0x0) {
        if (bVar1) {
          bVar2 = 1;
        }
        pcVar15 = "%{if-warning}";
        goto LAB_002119b8;
      }
      goto LAB_00211f4d;
    }
    break;
  case 0xe:
    rhs_14.m_data = "%{if-category}";
    rhs_14.m_size = 0xe;
    lhs_13.m_data = local_f8.d.ptr;
    lhs_13.m_size = 0xe;
    bVar6 = QtPrivate::equalStrings(lhs_13,rhs_14);
    if (bVar6) {
      ppcVar13 = (this->tokens)._M_t.
                 super___uniq_ptr_impl<const_char_*,_std::default_delete<const_char_*[]>_>._M_t.
                 super__Tuple_impl<0UL,_const_char_**,_std::default_delete<const_char_*[]>_>.
                 super__Head_base<0UL,_const_char_**,_false>._M_head_impl;
      if (ppcVar13 == (char **)0x0) goto LAB_00211f85;
      if (bVar1) {
        bVar2 = 1;
      }
      pcVar15 = "%{if-category}";
    }
    else {
      rhs_16.m_data = "%{if-critical}";
      rhs_16.m_size = 0xe;
      lhs_15.m_data = local_f8.d.ptr;
      lhs_15.m_size = 0xe;
      bVar6 = QtPrivate::equalStrings(lhs_15,rhs_16);
      if (!bVar6) goto LAB_002119c7;
      ppcVar13 = (this->tokens)._M_t.
                 super___uniq_ptr_impl<const_char_*,_std::default_delete<const_char_*[]>_>._M_t.
                 super__Tuple_impl<0UL,_const_char_**,_std::default_delete<const_char_*[]>_>.
                 super__Head_base<0UL,_const_char_**,_false>._M_head_impl;
      if (ppcVar13 == (char **)0x0) goto LAB_00211fbd;
      if (bVar1) {
        bVar2 = 1;
      }
      pcVar15 = "%{if-critical}";
    }
LAB_002119b8:
    ppcVar13[uVar19] = pcVar15;
    bVar1 = true;
    goto LAB_0021137a;
  }
  ppcVar13 = (this->tokens)._M_t.
             super___uniq_ptr_impl<const_char_*,_std::default_delete<const_char_*[]>_>._M_t.
             super__Tuple_impl<0UL,_const_char_**,_std::default_delete<const_char_*[]>_>.
             super__Head_base<0UL,_const_char_**,_false>._M_head_impl;
  if (ppcVar13 == (char **)0x0) goto LAB_00211ef9;
  ppcVar13[uVar19] = "";
  local_58.a.a.m_size = 0x28;
  local_58.a.a.m_data = "QT_MESSAGE_PATTERN: Unknown placeholder ";
  local_58.b.ch = '\n';
  local_58.a.b = &local_f8;
  ::operator+=(&local_d8,&local_58);
LAB_0021137a:
  if (&(local_f8.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_f8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_f8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_f8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_f8.d.d)->super_QArrayData,2,0x10);
    }
  }
  uVar19 = uVar19 + 1;
  lVar20 = lVar20 + 3;
  if ((ulong)local_78.size <= uVar19) goto LAB_00211b8e;
  goto LAB_00210f64;
LAB_00211b8e:
  if (bVar1 || bVar2 != 0) {
    pcVar15 = "QT_MESSAGE_PATTERN: missing %{endif}\n";
    if (bVar2 != 0) {
      pcVar15 = "QT_MESSAGE_PATTERN: %{if-*} cannot be nested\n";
    }
    str_01.m_data = pcVar15;
    str_01.m_size = (ulong)bVar2 * 8 + 0x25;
    QString::append(&local_d8,str_01);
  }
LAB_00211bc9:
  if ((QMessageLogContext *)local_d8.d.size != (QMessageLogContext *)0x0) {
    QString::chop(&local_d8,1);
    stderr_message_handler
              ((QtMsgType)local_d8.d.ptr,(QMessageLogContext *)local_d8.d.size,formattedMessage);
  }
  __last = local_b8.
           super__Vector_base<std::unique_ptr<const_char[],_std::default_delete<const_char[]>_>,_std::allocator<std::unique_ptr<const_char[],_std::default_delete<const_char[]>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  __first = local_b8.
            super__Vector_base<std::unique_ptr<const_char[],_std::default_delete<const_char[]>_>,_std::allocator<std::unique_ptr<const_char[],_std::default_delete<const_char[]>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  uVar18 = (long)local_b8.
                 super__Vector_base<std::unique_ptr<const_char[],_std::default_delete<const_char[]>_>,_std::allocator<std::unique_ptr<const_char[],_std::default_delete<const_char[]>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)local_b8.
                 super__Vector_base<std::unique_ptr<const_char[],_std::default_delete<const_char[]>_>,_std::allocator<std::unique_ptr<const_char[],_std::default_delete<const_char[]>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
  lVar20 = (long)uVar18 >> 3;
  uVar19 = lVar20 + 1;
  lVar20 = lVar20 * 8;
  uVar16 = 0xffffffffffffffff;
  if (lVar20 + 8U < 0xfffffffffffffff8) {
    uVar16 = lVar20 + 0x10;
  }
  puVar14 = (ulong *)operator_new__(-(ulong)(uVar19 >> 0x3d != 0) | uVar16);
  *puVar14 = uVar19;
  __result._M_head_impl =
       (unique_ptr<const_char[],_std::default_delete<const_char[]>_> *)(puVar14 + 1);
  if (uVar19 != 0) {
    memset(__result._M_head_impl,0,(uVar18 & 0xfffffffffffffff8) + 8);
  }
  __ptr._M_head_impl =
       (this->literals)._M_t.
       super___uniq_ptr_impl<std::unique_ptr<const_char[],_std::default_delete<const_char[]>_>,_std::default_delete<std::unique_ptr<const_char[],_std::default_delete<const_char[]>_>[]>_>
       ._M_t.
       super__Tuple_impl<0UL,_std::unique_ptr<const_char[],_std::default_delete<const_char[]>_>_*,_std::default_delete<std::unique_ptr<const_char[],_std::default_delete<const_char[]>_>[]>_>
       .
       super__Head_base<0UL,_std::unique_ptr<const_char[],_std::default_delete<const_char[]>_>_*,_false>
       ._M_head_impl;
  (this->literals)._M_t.
  super___uniq_ptr_impl<std::unique_ptr<const_char[],_std::default_delete<const_char[]>_>,_std::default_delete<std::unique_ptr<const_char[],_std::default_delete<const_char[]>_>[]>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::unique_ptr<const_char[],_std::default_delete<const_char[]>_>_*,_std::default_delete<std::unique_ptr<const_char[],_std::default_delete<const_char[]>_>[]>_>
  .super__Head_base<0UL,_std::unique_ptr<const_char[],_std::default_delete<const_char[]>_>_*,_false>
  ._M_head_impl = __result._M_head_impl;
  if (__ptr._M_head_impl != (unique_ptr<const_char[],_std::default_delete<const_char[]>_> *)0x0) {
    std::default_delete<std::unique_ptr<char_const[],std::default_delete<char_const[]>>[]>::
    operator()((default_delete<std::unique_ptr<char_const[],std::default_delete<char_const[]>>[]> *)
               this,__ptr._M_head_impl);
    __result._M_head_impl =
         (this->literals)._M_t.
         super___uniq_ptr_impl<std::unique_ptr<const_char[],_std::default_delete<const_char[]>_>,_std::default_delete<std::unique_ptr<const_char[],_std::default_delete<const_char[]>_>[]>_>
         ._M_t.
         super__Tuple_impl<0UL,_std::unique_ptr<const_char[],_std::default_delete<const_char[]>_>_*,_std::default_delete<std::unique_ptr<const_char[],_std::default_delete<const_char[]>_>[]>_>
         .
         super__Head_base<0UL,_std::unique_ptr<const_char[],_std::default_delete<const_char[]>_>_*,_false>
         ._M_head_impl;
    __first = local_b8.
              super__Vector_base<std::unique_ptr<const_char[],_std::default_delete<const_char[]>_>,_std::allocator<std::unique_ptr<const_char[],_std::default_delete<const_char[]>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    __last = local_b8.
             super__Vector_base<std::unique_ptr<const_char[],_std::default_delete<const_char[]>_>,_std::allocator<std::unique_ptr<const_char[],_std::default_delete<const_char[]>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (__result._M_head_impl == (unique_ptr<const_char[],_std::default_delete<const_char[]>_> *)0x0
       ) goto LAB_00211d71;
  }
  std::__copy_move<true,false,std::random_access_iterator_tag>::
  __copy_m<std::unique_ptr<char_const[],std::default_delete<char_const[]>>*,std::unique_ptr<char_const[],std::default_delete<char_const[]>>*>
            (__first,__last,__result._M_head_impl);
  if (&(local_d8.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_d8.d.d)->super_QArrayData,2,0x10);
    }
  }
  std::
  vector<std::unique_ptr<const_char[],_std::default_delete<const_char[]>_>,_std::allocator<std::unique_ptr<const_char[],_std::default_delete<const_char[]>_>_>_>
  ::~vector(&local_b8);
  if (&(local_98.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_98.d.d)->super_QArrayData,2,0x10);
    }
  }
  QArrayDataPointer<QString>::~QArrayDataPointer(&local_78);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
LAB_00212257:
  __stack_chk_fail();
}

Assistant:

void QMessagePattern::setPattern(const QString &pattern)
{
    timeArgs.clear();
#ifdef QLOGGING_HAVE_BACKTRACE
    backtraceArgs.clear();
    maxBacktraceDepth = 0;
#endif

    // scanner
    QList<QString> lexemes;
    QString lexeme;
    bool inPlaceholder = false;
    for (int i = 0; i < pattern.size(); ++i) {
        const QChar c = pattern.at(i);
        if (c == u'%' && !inPlaceholder) {
            if ((i + 1 < pattern.size())
                    && pattern.at(i + 1) == u'{') {
                // beginning of placeholder
                if (!lexeme.isEmpty()) {
                    lexemes.append(lexeme);
                    lexeme.clear();
                }
                inPlaceholder = true;
            }
        }

        lexeme.append(c);

        if (c == u'}' && inPlaceholder) {
            // end of placeholder
            lexemes.append(lexeme);
            lexeme.clear();
            inPlaceholder = false;
        }
    }
    if (!lexeme.isEmpty())
        lexemes.append(lexeme);

    // tokenizer
    std::vector<std::unique_ptr<const char[]>> literalsVar;
    tokens.reset(new const char *[lexemes.size() + 1]);
    tokens[lexemes.size()] = nullptr;

    bool nestedIfError = false;
    bool inIf = false;
    QString error;

    for (int i = 0; i < lexemes.size(); ++i) {
        const QString lexeme = lexemes.at(i);
        if (lexeme.startsWith("%{"_L1) && lexeme.endsWith(u'}')) {
            // placeholder
            if (lexeme == QLatin1StringView(typeTokenC)) {
                tokens[i] = typeTokenC;
            } else if (lexeme == QLatin1StringView(categoryTokenC))
                tokens[i] = categoryTokenC;
            else if (lexeme == QLatin1StringView(messageTokenC))
                tokens[i] = messageTokenC;
            else if (lexeme == QLatin1StringView(fileTokenC))
                tokens[i] = fileTokenC;
            else if (lexeme == QLatin1StringView(lineTokenC))
                tokens[i] = lineTokenC;
            else if (lexeme == QLatin1StringView(functionTokenC))
                tokens[i] = functionTokenC;
            else if (lexeme == QLatin1StringView(pidTokenC))
                tokens[i] = pidTokenC;
            else if (lexeme == QLatin1StringView(appnameTokenC))
                tokens[i] = appnameTokenC;
            else if (lexeme == QLatin1StringView(threadidTokenC))
                tokens[i] = threadidTokenC;
            else if (lexeme == QLatin1StringView(threadnameTokenC))
                tokens[i] = threadnameTokenC;
            else if (lexeme == QLatin1StringView(qthreadptrTokenC))
                tokens[i] = qthreadptrTokenC;
            else if (lexeme.startsWith(QLatin1StringView(timeTokenC))) {
                tokens[i] = timeTokenC;
                qsizetype spaceIdx = lexeme.indexOf(QChar::fromLatin1(' '));
                if (spaceIdx > 0)
                    timeArgs.append(lexeme.mid(spaceIdx + 1, lexeme.size() - spaceIdx - 2));
                else
                    timeArgs.append(QString());
            } else if (lexeme.startsWith(QLatin1StringView(backtraceTokenC))) {
#ifdef QLOGGING_HAVE_BACKTRACE
                tokens[i] = backtraceTokenC;
                QString backtraceSeparator = QStringLiteral("|");
                int backtraceDepth = 5;
                static const QRegularExpression depthRx(QStringLiteral(" depth=(?|\"([^\"]*)\"|([^ }]*))"));
                static const QRegularExpression separatorRx(QStringLiteral(" separator=(?|\"([^\"]*)\"|([^ }]*))"));
                QRegularExpressionMatch m = depthRx.match(lexeme);
                if (m.hasMatch()) {
                    int depth = m.capturedView(1).toInt();
                    if (depth <= 0)
                        error += "QT_MESSAGE_PATTERN: %{backtrace} depth must be a number greater than 0\n"_L1;
                    else
                        backtraceDepth = depth;
                }
                m = separatorRx.match(lexeme);
                if (m.hasMatch())
                    backtraceSeparator = m.captured(1);
                BacktraceParams backtraceParams;
                backtraceParams.backtraceDepth = backtraceDepth;
                backtraceParams.backtraceSeparator = backtraceSeparator;
                backtraceArgs.append(backtraceParams);
                maxBacktraceDepth = qMax(maxBacktraceDepth, backtraceDepth);
#else
                error += "QT_MESSAGE_PATTERN: %{backtrace} is not supported by this Qt build\n"_L1;
                tokens[i] = "";
#endif
            }

#define IF_TOKEN(LEVEL) \
            else if (lexeme == QLatin1StringView(LEVEL)) { \
                if (inIf) \
                    nestedIfError = true; \
                tokens[i] = LEVEL; \
                inIf = true; \
            }
            IF_TOKEN(ifCategoryTokenC)
            IF_TOKEN(ifDebugTokenC)
            IF_TOKEN(ifInfoTokenC)
            IF_TOKEN(ifWarningTokenC)
            IF_TOKEN(ifCriticalTokenC)
            IF_TOKEN(ifFatalTokenC)
#undef IF_TOKEN
            else if (lexeme == QLatin1StringView(endifTokenC)) {
                tokens[i] = endifTokenC;
                if (!inIf && !nestedIfError)
                    error += "QT_MESSAGE_PATTERN: %{endif} without an %{if-*}\n"_L1;
                inIf = false;
            } else {
                tokens[i] = emptyTokenC;
                error += "QT_MESSAGE_PATTERN: Unknown placeholder "_L1 + lexeme + '\n'_L1;
            }
        } else {
            using UP = std::unique_ptr<char[]>;
            tokens[i] = literalsVar.emplace_back(UP(qstrdup(lexeme.toLatin1().constData()))).get();
        }